

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_get_ecdh_params_from_cert(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  int iVar2;
  mbedtls_pk_context *pmVar3;
  mbedtls_ecp_keypair *key;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmVar3 = mbedtls_ssl_own_key(ssl);
  iVar2 = mbedtls_pk_can_do(pmVar3,MBEDTLS_PK_ECKEY);
  if (iVar2 == 0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x9d7,"server key not ECDH capable");
    ssl_local._4_4_ = -0x6d00;
  }
  else {
    pmVar1 = ssl->handshake;
    pmVar3 = mbedtls_ssl_own_key(ssl);
    key = mbedtls_pk_ec(*pmVar3);
    ssl_local._4_4_ = mbedtls_ecdh_get_params(&pmVar1->ecdh_ctx,key,MBEDTLS_ECDH_OURS);
    if (ssl_local._4_4_ == 0) {
      ssl_local._4_4_ = 0;
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x9df,"mbedtls_ecdh_get_params",ssl_local._4_4_);
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_get_ecdh_params_from_cert( mbedtls_ssl_context *ssl )
{
    int ret;

    if( ! mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECKEY ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server key not ECDH capable" ) );
        return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
    }

    if( ( ret = mbedtls_ecdh_get_params( &ssl->handshake->ecdh_ctx,
                                 mbedtls_pk_ec( *mbedtls_ssl_own_key( ssl ) ),
                                 MBEDTLS_ECDH_OURS ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ecdh_get_params" ), ret );
        return( ret );
    }

    return( 0 );
}